

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O3

bool __thiscall VvcUnit::dpb_parameters(VvcUnit *this,int MaxSubLayersMinus1,bool subLayerInfoFlag)

{
  uint uVar1;
  uint uVar2;
  undefined3 in_register_00000011;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = MaxSubLayersMinus1;
  if (CONCAT31(in_register_00000011,subLayerInfoFlag) != 0) {
    uVar4 = uVar3;
  }
  if ((int)uVar4 <= MaxSubLayersMinus1) {
    uVar1 = extractUEGolombCode(this);
    uVar2 = extractUEGolombCode(this);
    uVar3 = 1;
    if (uVar2 <= uVar1) {
      uVar3 = 1;
      do {
        uVar1 = extractUEGolombCode(this);
        if ((uVar1 == 0xffffffff) ||
           (uVar3 = (uint)((int)uVar4 < MaxSubLayersMinus1), uVar4 == MaxSubLayersMinus1)) break;
        uVar4 = uVar4 + 1;
        uVar1 = extractUEGolombCode(this);
        uVar2 = extractUEGolombCode(this);
      } while (uVar2 <= uVar1);
    }
  }
  return SUB41(uVar3,0);
}

Assistant:

bool VvcUnit::dpb_parameters(const int MaxSubLayersMinus1, const bool subLayerInfoFlag)
{
    for (int i = (subLayerInfoFlag ? 0 : MaxSubLayersMinus1); i <= MaxSubLayersMinus1; i++)
    {
        const unsigned dpb_max_dec_pic_buffering_minus1 = extractUEGolombCode();
        const unsigned dpb_max_num_reorder_pics = extractUEGolombCode();
        if (dpb_max_num_reorder_pics > dpb_max_dec_pic_buffering_minus1)
            return true;
        const unsigned dpb_max_latency_increase_plus1 = extractUEGolombCode();
        if (dpb_max_latency_increase_plus1 == UINT_MAX)
            return true;
    }
    return false;
}